

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

Vec_Int_t *
findNewDisjunctiveMonotone
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors)

{
  uint uVar1;
  int Entry;
  Aig_Man_t *pAig_00;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  int poMarker;
  Pdr_Par_t Pars;
  
  uVar1 = aigPoIndicesArg->attrPendingSignalIndex;
  pAig_00 = createDisjunctiveMonotoneTester(pAig,aigPoIndicesArg,anteConseVectors,&poMarker);
  p = Vec_IntAlloc(0);
  for (iVar4 = 0; iVar4 < pAig_00->nTruePos; iVar4 = iVar4 + 1) {
    pAVar2 = Aig_ManCo(pAig_00,iVar4);
    Aig_ObjChild0Flip(pAVar2);
  }
  Pdr_ManSetDefaultParams(&Pars);
  Pars.fVerbose = 0;
  Pars.fNotVerbose = 1;
  pAig_00->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Pars.fSolveAll = Pars.fNotVerbose;
  Pdr_ManSolve(pAig_00,&Pars);
  p_00 = pAig_00->vSeqModelVec;
  if (p_00 != (Vec_Ptr_t *)0x0) {
    for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
      pvVar3 = Vec_PtrEntry(p_00,iVar4);
      if ((int)uVar1 < iVar4 && pvVar3 == (void *)0x0) {
        Entry = Vec_IntEntry(anteConseVectors->attrConsequentCandidates,iVar4 + ~uVar1);
        Vec_IntPush(p,Entry);
      }
      p_00 = pAig_00->vSeqModelVec;
    }
  }
  for (iVar4 = 0; iVar4 < pAig_00->nTruePos; iVar4 = iVar4 + 1) {
    pAVar2 = Aig_ManCo(pAig_00,iVar4);
    Aig_ObjChild0Flip(pAVar2);
  }
  Aig_ManStop(pAig_00);
  if (p->nSize < 1) {
    Vec_IntFree(p);
    p = (Vec_Int_t *)0x0;
  }
  return p;
}

Assistant:

Vec_Int_t *findNewDisjunctiveMonotone( Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct antecedentConsequentVectorsStruct *anteConseVectors )
{
    Aig_Man_t *pAigNew;
    Aig_Obj_t *pObjTargetPo;
    int poMarker;
    //int i, RetValue, poSerialNum;
    int i, poSerialNum;
    Pdr_Par_t Pars, * pPars = &Pars;
    //Abc_Cex_t * pCex = NULL;
    Vec_Int_t *vMonotoneIndex;
    //char fileName[20];
    Abc_Cex_t * cexElem;

    int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

    pAigNew = createDisjunctiveMonotoneTester(pAig, aigPoIndicesArg, anteConseVectors, &poMarker );

    //printf("enter an integer : ");
    //waitForInteger = getchar();
    //putchar(waitForInteger);

    vMonotoneIndex = Vec_IntAlloc(0);

    for( i=0; i<Saig_ManPoNum(pAigNew); i++ )
    {
        pObjTargetPo = Aig_ManCo( pAigNew, i );
        Aig_ObjChild0Flip( pObjTargetPo );
    }

    Pdr_ManSetDefaultParams( pPars );
    pPars->fVerbose = 0;
    pPars->fNotVerbose = 1;
    pPars->fSolveAll = 1;
    pAigNew->vSeqModelVec = NULL;
    Pdr_ManSolve( pAigNew, pPars );    

    if( pAigNew->vSeqModelVec )
    {
        Vec_PtrForEachEntry( Abc_Cex_t *, pAigNew->vSeqModelVec, cexElem, i )
        {
            if( cexElem == NULL  && i >= pendingSignalIndexLocal + 1)
            {
                poSerialNum = i - (pendingSignalIndexLocal + 1);
                Vec_IntPush( vMonotoneIndex, Vec_IntEntry( anteConseVectors->attrConsequentCandidates, poSerialNum ));
            }
        }
    }
    for( i=0; i<Saig_ManPoNum(pAigNew); i++ )
    {
        pObjTargetPo = Aig_ManCo( pAigNew, i );
        Aig_ObjChild0Flip( pObjTargetPo );
    }
    
    //if(pAigNew->vSeqModelVec)
    //    Vec_PtrFree(pAigNew->vSeqModelVec);

    Aig_ManStop(pAigNew);
    
    if( Vec_IntSize( vMonotoneIndex ) > 0 )
    {
        return vMonotoneIndex;
    }
    else
    {
        Vec_IntFree(vMonotoneIndex);
        return NULL;
    }
}